

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  void **this;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  deBool dVar3;
  int iVar4;
  TextureChannelClass TVar5;
  InternalError *this_00;
  TextureFormat *pTVar6;
  MessageBuilder *pMVar7;
  TestLog *pTVar8;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  LogImage local_8b0;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  LogImageSet local_7d0;
  TextureFormat local_78c;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  LogImage local_738;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  LogImage local_658;
  allocator<char> local_5c1;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  LogImage local_578;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  LogImageSet local_498;
  MessageBuilder local_458;
  MessageBuilder local_2d8;
  Vector<bool,_4> local_155;
  byte local_151;
  undefined1 local_150 [7];
  bool compareOk;
  tcu local_140 [19];
  Vector<bool,_4> local_12d;
  byte local_129;
  undefined1 local_128 [7];
  bool isOk;
  undefined1 local_118 [8];
  Vec4 diff;
  Vec4 cmpPix;
  Vec4 refPix;
  int x;
  int y;
  int z;
  Vec4 pixelScale;
  Vec4 pixelBias;
  Vec4 maxDiff;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  Vec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  width_00 = ConstPixelBufferAccess::getWidth(reference);
  height_00 = ConstPixelBufferAccess::getHeight(reference);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getDepth(reference);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,width_00,height_00,
             errorMaskStorage.m_data.m_cap._4_4_);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelBias.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)&y,1.0,1.0,1.0,1.0);
  do {
    dVar3 = ::deGetFalse();
    if ((((dVar3 != 0) || (iVar4 = ConstPixelBufferAccess::getWidth(result), iVar4 != width_00)) ||
        (iVar4 = ConstPixelBufferAccess::getHeight(result), iVar4 != height_00)) ||
       (iVar4 = ConstPixelBufferAccess::getDepth(result),
       iVar4 != errorMaskStorage.m_data.m_cap._4_4_)) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_00,(char *)0x0,
                 "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
                 ,0x249);
      __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  for (x = 0; x < errorMaskStorage.m_data.m_cap._4_4_; x = x + 1) {
    for (refPix.m_data[3] = 0.0; (int)refPix.m_data[3] < height_00;
        refPix.m_data[3] = (float)((int)refPix.m_data[3] + 1)) {
      for (refPix.m_data[2] = 0.0; (int)refPix.m_data[2] < width_00;
          refPix.m_data[2] = (float)((int)refPix.m_data[2] + 1)) {
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)(cmpPix.m_data + 2),(int)reference,
                   (int)refPix.m_data[2],(int)refPix.m_data[3]);
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)result,(int)refPix.m_data[2],
                   (int)refPix.m_data[3]);
        operator-((tcu *)local_128,(Vector<float,_4> *)(cmpPix.m_data + 2),
                  (Vector<float,_4> *)(diff.m_data + 2));
        abs<float,4>((tcu *)local_118,(Vector<float,_4> *)local_128);
        lessThanEqual<float,4>((tcu *)&local_12d,(Vector<float,_4> *)local_118,threshold);
        local_129 = boolAll<4>(&local_12d);
        max<float,4>(local_140,(Vector<float,_4> *)(pixelBias.m_data + 2),
                     (Vector<float,_4> *)local_118);
        pixelBias.m_data._8_8_ = local_140._0_8_;
        if ((local_129 & 1) == 0) {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_150,1.0,0.0,0.0,1.0);
        }
        else {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_150,0.0,1.0,0.0,1.0);
        }
        PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_a0,(Vec4 *)local_150,(int)refPix.m_data[2],
                   (int)refPix.m_data[3],x);
      }
    }
  }
  lessThanEqual<float,4>((tcu *)&local_155,(Vector<float,_4> *)(pixelBias.m_data + 2),threshold);
  local_151 = boolAll<4>(&local_155);
  if (((bool)local_151) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar6 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_78c,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar6,&local_78c);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f0,imageSetName,&local_7f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,imageSetDesc,&local_819);
      LogImageSet::LogImageSet(&local_7d0,&local_7f0,&local_818);
      pTVar8 = TestLog::operator<<(log,&local_7d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"Result",&local_8d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8f8,"Result",&local_8f9);
      LogImage::LogImage(&local_8b0,&local_8d0,&local_8f8,result,(Vec4 *)&y,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = TestLog::operator<<(pTVar8,&local_8b0);
      TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_8b0);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::allocator<char>::~allocator(&local_8f9);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::allocator<char>::~allocator(&local_8d1);
      LogImageSet::~LogImageSet(&local_7d0);
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
    }
    goto LAB_0126682c;
  }
  pTVar6 = ConstPixelBufferAccess::getFormat(reference);
  TVar5 = getTextureChannelClass(pTVar6->type);
  if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    pTVar6 = ConstPixelBufferAccess::getFormat(result);
    TVar5 = getTextureChannelClass(pTVar6->type);
    if (TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_01265cb4;
  }
  else {
LAB_01265cb4:
    anon_unknown_47::computeScaleAndBias
              (reference,result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
    TestLog::operator<<(&local_2d8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_2d8,
                        (char (*) [61])
                        "Result and reference images are normalized with formula p * ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)&y);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [4])0x136cffb);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)(pixelScale.m_data + 2));
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_2d8);
  }
  if ((local_151 & 1) == 0) {
    TestLog::operator<<(&local_458,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_458,(char (*) [43])"Image comparison failed: max difference = ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)(pixelBias.m_data + 2));
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [15])0x13c0da5);
    pMVar7 = MessageBuilder::operator<<(pMVar7,threshold);
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_458);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,imageSetName,&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,imageSetDesc,&local_4e1);
  LogImageSet::LogImageSet(&local_498,&local_4b8,&local_4e0);
  pTVar8 = TestLog::operator<<(log,&local_498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_598,"Result",&local_599);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c0,"Result",&local_5c1);
  LogImage::LogImage(&local_578,&local_598,&local_5c0,result,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_578);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"Reference",&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"Reference",&local_6a1);
  LogImage::LogImage(&local_658,&local_678,&local_6a0,reference,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"ErrorMask",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"Error mask",&local_781);
  LogImage::LogImage(&local_738,&local_758,&local_780,(ConstPixelBufferAccess *)local_a0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_738);
  TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
  LogImage::~LogImage(&local_738);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  LogImage::~LogImage(&local_658);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  LogImage::~LogImage(&local_578);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator(&local_599);
  LogImageSet::~LogImageSet(&local_498);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
LAB_0126682c:
  bVar1 = local_151;
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return (bool)(bVar1 & 1);
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				Vec4	refPix		= reference.getPixel(x, y, z);
				Vec4	cmpPix		= result.getPixel(x, y, z);

				Vec4	diff		= abs(refPix - cmpPix);
				bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}